

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O2

lookahead_entry * av1_lookahead_peek(lookahead_ctx *ctx,int index,COMPRESSOR_STAGE stage)

{
  int iVar1;
  int iVar2;
  
  if (ctx == (lookahead_ctx *)0x0) {
    return (lookahead_entry *)0x0;
  }
  if (index < 0) {
    if ((uint)ctx->max_pre_frames < (uint)-index) {
      return (lookahead_entry *)0x0;
    }
    iVar2 = index + ctx->read_ctxs[stage].read_idx;
    if (iVar2 < 0) {
      iVar2 = iVar2 + ctx->max_sz;
    }
  }
  else {
    if (ctx->read_ctxs[stage].sz <= index) {
      return (lookahead_entry *)0x0;
    }
    iVar2 = index + ctx->read_ctxs[stage].read_idx;
    iVar1 = 0;
    if (ctx->max_sz <= iVar2) {
      iVar1 = ctx->max_sz;
    }
    iVar2 = iVar2 - iVar1;
  }
  return ctx->buf + iVar2;
}

Assistant:

struct lookahead_entry *av1_lookahead_peek(struct lookahead_ctx *ctx, int index,
                                           COMPRESSOR_STAGE stage) {
  struct lookahead_entry *buf = NULL;
  if (ctx == NULL) {
    return buf;
  }

  struct read_ctx *read_ctx = &ctx->read_ctxs[stage];
  assert(read_ctx->valid == 1);
  if (index >= 0) {
    // Forward peek
    if (index < read_ctx->sz) {
      index += read_ctx->read_idx;
      if (index >= ctx->max_sz) index -= ctx->max_sz;
      buf = ctx->buf + index;
    }
  } else if (index < 0) {
    // Backward peek
    if (-index <= ctx->max_pre_frames) {
      index += (int)(read_ctx->read_idx);
      if (index < 0) index += (int)(ctx->max_sz);
      buf = ctx->buf + index;
    }
  }

  return buf;
}